

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsonpath_selector.hpp
# Opt level: O0

string * __thiscall
jsoncons::jsonpath::detail::
recursive_selector<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>,jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>const&>
::to_string_abi_cxx11_
          (recursive_selector<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
           *this,int level)

{
  int in_EDX;
  string *in_RDI;
  string *s;
  string local_48 [44];
  int in_stack_ffffffffffffffe4;
  uint3 in_stack_ffffffffffffffe8;
  uint uVar1;
  
  uVar1 = (uint)in_stack_ffffffffffffffe8;
  std::__cxx11::string::string((string *)in_RDI);
  if (0 < in_EDX) {
    std::__cxx11::string::append((char *)in_RDI);
    std::__cxx11::string::append((ulong)in_RDI,(char)in_EDX * '\x02');
  }
  std::__cxx11::string::append((char *)in_RDI);
  base_selector<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>,jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>const&>
  ::to_string_abi_cxx11_
            ((base_selector<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
              *)CONCAT44(in_EDX,uVar1),in_stack_ffffffffffffffe4);
  std::__cxx11::string::append((string *)in_RDI);
  std::__cxx11::string::~string(local_48);
  return in_RDI;
}

Assistant:

std::string to_string(int level) const override
        {
            std::string s;
            if (level > 0)
            {
                s.append("\n");
                s.append(std::size_t(level)*2, ' ');
            }
            s.append("wildcard selector");
            s.append(base_selector<Json,JsonReference>::to_string(level));

            return s;
        }